

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O1

optional<tinyusdz::Token> * __thiscall
tinyusdz::crate::CrateReader::GetStringToken
          (optional<tinyusdz::Token> *__return_storage_ptr__,CrateReader *this,Index string_index)

{
  pointer pIVar1;
  long lVar2;
  bool bVar3;
  char cVar4;
  char cVar5;
  ostream *poVar6;
  long *plVar7;
  long *plVar8;
  Index IVar9;
  string __str;
  ostringstream ss_e;
  long *local_1e8;
  long local_1d8;
  long lStack_1d0;
  long *local_1c8;
  uint local_1c0;
  long local_1b8 [2];
  ostringstream local_1a8 [17];
  undefined8 local_197;
  undefined4 local_18f;
  undefined2 local_18b;
  undefined1 local_189;
  ios_base local_138 [264];
  
  pIVar1 = (this->_string_indices).
           super__Vector_base<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((ulong)string_index.value <
      (ulong)((long)(this->_string_indices).
                    super__Vector_base<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar1 >> 2)) {
    GetToken(__return_storage_ptr__,this,(Index)pIVar1[string_index.value].value);
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream(local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
               ,0x56);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"GetStringToken",0xe);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
    poVar6 = (ostream *)::std::ostream::operator<<(local_1a8,0x9e);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
    cVar5 = '\x01';
    if (9 < string_index.value) {
      IVar9.value = string_index.value;
      cVar4 = '\x04';
      do {
        cVar5 = cVar4;
        if (IVar9.value < 100) {
          cVar5 = cVar5 + -2;
          goto LAB_001bb25c;
        }
        if (IVar9.value < 1000) {
          cVar5 = cVar5 + -1;
          goto LAB_001bb25c;
        }
        if (IVar9.value < 10000) goto LAB_001bb25c;
        bVar3 = 99999 < IVar9.value;
        IVar9.value = IVar9.value / 10000;
        cVar4 = cVar5 + '\x04';
      } while (bVar3);
      cVar5 = cVar5 + '\x01';
    }
LAB_001bb25c:
    local_1c8 = local_1b8;
    ::std::__cxx11::string::_M_construct((ulong)&local_1c8,cVar5);
    ::std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)local_1c8,local_1c0,string_index.value);
    plVar7 = (long *)::std::__cxx11::string::replace((ulong)&local_1c8,0,(char *)0x0,0x428400);
    plVar8 = plVar7 + 2;
    if ((long *)*plVar7 == plVar8) {
      local_1d8 = *plVar8;
      lStack_1d0 = plVar7[3];
      local_1e8 = &local_1d8;
    }
    else {
      local_1d8 = *plVar8;
      local_1e8 = (long *)*plVar7;
    }
    lVar2 = plVar7[1];
    *plVar7 = (long)plVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(char *)local_1e8,lVar2);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    if (local_1e8 != &local_1d8) {
      operator_delete(local_1e8,local_1d8 + 1);
    }
    if (local_1c8 != local_1b8) {
      operator_delete(local_1c8,local_1b8[0] + 1);
    }
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_1e8);
    if (local_1e8 != &local_1d8) {
      operator_delete(local_1e8,local_1d8 + 1);
    }
    ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
    ::std::ios_base::~ios_base(local_138);
    __return_storage_ptr__->has_value_ = true;
    *(undefined1 **)&__return_storage_ptr__->contained =
         (undefined1 *)((long)&__return_storage_ptr__->contained + 0x10);
    *(undefined1 *)((long)&__return_storage_ptr__->contained + 0x10) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x11) = local_197;
    *(undefined4 *)((long)&__return_storage_ptr__->contained + 0x19) = local_18f;
    *(undefined2 *)((long)&__return_storage_ptr__->contained + 0x1d) = local_18b;
    *(undefined1 *)((long)&__return_storage_ptr__->contained + 0x1f) = local_189;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 8) = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

const nonstd::optional<value::token> CrateReader::GetStringToken(
    crate::Index string_index) const {

  if (string_index.value < _string_indices.size()) {
    crate::Index s_idx = _string_indices[string_index.value];
    return GetToken(s_idx);
  } else {
    PUSH_ERROR("String index out of range: " +
               std::to_string(string_index.value));
    return value::token();
  }
}